

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O0

void __thiscall QPrintDialogPrivate::setTabs(QPrintDialogPrivate *this,QList<QWidget_*> *tabWidgets)

{
  QWidget *pQVar1;
  bool bVar2;
  const_iterator o;
  QWidget **ppQVar3;
  long in_RDI;
  long in_FS_OFFSET;
  QWidget *tab;
  ConstIterator iter;
  QWidget *in_stack_ffffffffffffffa0;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QWidget **)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<QWidget_*>::begin((QList<QWidget_*> *)in_stack_ffffffffffffffa0);
  while( true ) {
    o = QList<QWidget_*>::constEnd((QList<QWidget_*> *)in_stack_ffffffffffffffa0);
    bVar2 = QList<QWidget_*>::const_iterator::operator!=(&local_10,o);
    if (!bVar2) break;
    ppQVar3 = QList<QWidget_*>::const_iterator::operator*(&local_10);
    pQVar1 = *ppQVar3;
    in_stack_ffffffffffffffa0 = *(QWidget **)(in_RDI + 0x330);
    QWidget::windowTitle();
    QTabWidget::addTab(in_stack_ffffffffffffffa0,(QString *)pQVar1);
    QString::~QString((QString *)0x170066);
    QList<QWidget_*>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintDialogPrivate::setTabs(const QList<QWidget*> &tabWidgets)
{
    QList<QWidget*>::ConstIterator iter = tabWidgets.begin();
    while(iter != tabWidgets.constEnd()) {
        QWidget *tab = *iter;
        options.tabs->addTab(tab, tab->windowTitle());
        ++iter;
    }
}